

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnExport
          (SharedValidator *this,Location *loc,ExternalKind kind,Var *item_var,string_view name)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  char *pcVar4;
  int __c;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar6;
  Var local_238;
  Enum local_1ec;
  Var local_1e8;
  Enum local_19c;
  Var local_198;
  Enum local_14c;
  Var local_148;
  Enum local_fc;
  _Base_ptr local_f8;
  undefined1 local_f0;
  value_type_conflict2 local_e4;
  Var local_e0;
  Enum local_94;
  _Base_ptr local_90;
  undefined1 local_88;
  Enum local_7c;
  _Self local_78;
  _Self local_70;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string name_str;
  Var *item_var_local;
  ExternalKind kind_local;
  Location *loc_local;
  SharedValidator *this_local;
  string_view name_local;
  Result result;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (SharedValidator *)name._M_len;
  name_str.field_2._8_8_ = item_var;
  Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_60,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_61);
  std::allocator<char>::~allocator(&local_61);
  local_70._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->export_names_,(key_type *)local_60);
  local_78._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->export_names_);
  bVar1 = std::operator!=(&local_70,&local_78);
  if (bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_7c = (Enum)PrintError(this,loc,"duplicate export \"%.*s\"",sVar2 & 0xffffffff,pvVar3);
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_7c);
  }
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->export_names_,(value_type *)local_60);
  local_90 = (_Base_ptr)pVar5.first._M_node;
  local_88 = pVar5.second;
  switch(kind) {
  case First:
    Var::Var(&local_e0,item_var);
    local_94 = (Enum)CheckFuncIndex(this,&local_e0,(FuncType *)0x0);
    pcVar4 = (char *)(ulong)local_94;
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_94);
    Var::~Var(&local_e0);
    pcVar4 = Var::index(item_var,pcVar4,__c);
    local_e4 = (value_type_conflict2)pcVar4;
    pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (&this->declared_funcs_,&local_e4);
    local_f8 = (_Base_ptr)pVar6.first._M_node;
    local_f0 = pVar6.second;
    break;
  case Table:
    Var::Var(&local_148,item_var);
    local_fc = (Enum)CheckTableIndex(this,&local_148,(TableType *)0x0);
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_fc);
    Var::~Var(&local_148);
    break;
  case Memory:
    Var::Var(&local_198,item_var);
    local_14c = (Enum)CheckMemoryIndex(this,&local_198,(MemoryType *)0x0);
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_14c);
    Var::~Var(&local_198);
    break;
  case Global:
    Var::Var(&local_1e8,item_var);
    local_19c = (Enum)CheckGlobalIndex(this,&local_1e8,(GlobalType *)0x0);
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_19c);
    Var::~Var(&local_1e8);
    break;
  case Last:
    Var::Var(&local_238,item_var);
    local_1ec = (Enum)CheckTagIndex(this,&local_238,(TagType *)0x0);
    Result::operator|=((Result *)((long)&name_local._M_str + 4),(Result)local_1ec);
    Var::~Var(&local_238);
  }
  std::__cxx11::string::~string((string *)local_60);
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result SharedValidator::OnExport(const Location& loc,
                                 ExternalKind kind,
                                 Var item_var,
                                 std::string_view name) {
  Result result = Result::Ok;
  auto name_str = std::string(name);
  if (export_names_.find(name_str) != export_names_.end()) {
    result |= PrintError(loc, "duplicate export \"" PRIstringview "\"",
                         WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  export_names_.insert(name_str);

  switch (kind) {
    case ExternalKind::Func:
      result |= CheckFuncIndex(item_var);
      declared_funcs_.insert(item_var.index());
      break;

    case ExternalKind::Table:
      result |= CheckTableIndex(item_var);
      break;

    case ExternalKind::Memory:
      result |= CheckMemoryIndex(item_var);
      break;

    case ExternalKind::Global:
      result |= CheckGlobalIndex(item_var);
      break;

    case ExternalKind::Tag:
      result |= CheckTagIndex(item_var);
      break;
  }
  return result;
}